

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O2

xmlMutexPtr xmlNewMutex(void)

{
  xmlMutexPtr mutex;
  
  mutex = (xmlMutexPtr)malloc(0x28);
  if (mutex != (xmlMutexPtr)0x0) {
    xmlInitMutex(mutex);
  }
  return mutex;
}

Assistant:

xmlMutexPtr
xmlNewMutex(void)
{
    xmlMutexPtr tok;

    tok = malloc(sizeof(xmlMutex));
    if (tok == NULL)
        return (NULL);
    xmlInitMutex(tok);
    return (tok);
}